

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::AddSwitchForAccessChain
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *parent_block,
          uint32_t access_chain_index_var_id,uint32_t default_id,uint32_t merge_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *case_block_ids)

{
  uint32_t i;
  ulong uVar1;
  long lVar2;
  initializer_list<unsigned_int> init_list;
  uint local_9c;
  vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  cases;
  InstructionBuilder builder;
  SmallVector<unsigned_int,_2UL> local_58;
  
  InstructionBuilder::InstructionBuilder
            (&builder,(this->super_Pass).context_,parent_block,
             (uint)(anonymous_namespace)::kAnalysisDefUseAndInstrToBlockMapping * 3);
  cases.
  super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cases.
  super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cases.
  super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = 0;
  for (uVar1 = 0;
      uVar1 < ((ulong)((long)(case_block_ids->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(case_block_ids->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start) >> 2 & 0xffffffff); uVar1 = uVar1 + 1
      ) {
    local_9c = (uint)uVar1;
    init_list._M_len = 1;
    init_list._M_array = &local_9c;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
    std::
    vector<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>,std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>>>
    ::emplace_back<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int_const&>
              ((vector<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>,std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>>>
                *)&cases,&local_58,
               (uint *)((long)(case_block_ids->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar2));
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
    lVar2 = lVar2 + 4;
  }
  InstructionBuilder::AddSwitch(&builder,access_chain_index_var_id,default_id,&cases,merge_id,0);
  std::
  vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  ::~vector(&cases);
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::AddSwitchForAccessChain(
    BasicBlock* parent_block, uint32_t access_chain_index_var_id,
    uint32_t default_id, uint32_t merge_id,
    const std::vector<uint32_t>& case_block_ids) const {
  InstructionBuilder builder{context(), parent_block,
                             kAnalysisDefUseAndInstrToBlockMapping};
  std::vector<std::pair<Operand::OperandData, uint32_t>> cases;
  for (uint32_t i = 0; i < static_cast<uint32_t>(case_block_ids.size()); ++i) {
    cases.emplace_back(Operand::OperandData{i}, case_block_ids[i]);
  }
  builder.AddSwitch(access_chain_index_var_id, default_id, cases, merge_id);
}